

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerMain.cpp
# Opt level: O2

int __thiscall Analysis::LexicalAnalysis::Run(LexicalAnalysis *this)

{
  vector<int,_std::allocator<int>_> Table;
  vector<char,_std::allocator<char>_> Code;
  _Vector_base<int,_std::allocator<int>_> local_48;
  _Vector_base<char,_std::allocator<char>_> local_28;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ReadFile(this,(vector<char,_std::allocator<char>_> *)&local_28);
  PreTokenize(this,(vector<char,_std::allocator<char>_> *)&local_28,
              (vector<int,_std::allocator<int>_> *)&local_48);
  Tokenize(this,(vector<char,_std::allocator<char>_> *)&local_28,
           (vector<int,_std::allocator<int>_> *)&local_48);
  SpaceHandle(this);
  Assign(this);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return 0;
}

Assistant:

int LexicalAnalysis::Run() {

        //the vector to store the types of the chars. (parallel to Code)
        std::vector<int> Table;
        //the vector to store the chars of the code (parallel to Table)
        std::vector<char> Code;

        ReadFile(Code);
        PreTokenize(Code, Table);
        Tokenize(Code, Table);
        SpaceHandle();
        Assign();

        return 0;
    }